

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  uint uVar1;
  ushort uVar2;
  BtShared *pBVar3;
  MemPage *pMVar4;
  u8 *puVar5;
  uint uVar6;
  int iVar7;
  Pgno *pPVar8;
  undefined8 uVar9;
  size_t sVar10;
  uint uVar11;
  uchar *puVar12;
  uchar *puVar13;
  u32 uVar14;
  uint uVar15;
  uchar *puVar16;
  long lVar17;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_64;
  uchar *local_60;
  int local_54;
  size_t local_50;
  BtShared *local_48;
  int local_3c;
  PgHdr *local_38;
  
  pBVar3 = pCur->pBt;
  pMVar4 = pCur->pPage;
  local_60 = pBuf;
  local_54 = eOp;
  getCellInfo(pCur);
  puVar5 = (pCur->info).pPayload;
  uVar2 = (pCur->info).nLocal;
  uVar15 = (uint)uVar2;
  local_48 = pBVar3;
  if ((ulong)(pBVar3->usableSize - uVar15) < (ulong)((long)puVar5 - (long)pMVar4->aData)) {
    uVar9 = 0x109b0;
    goto LAB_0016647c;
  }
  if (uVar15 < offset || uVar15 - offset == 0) {
    uVar15 = offset - uVar2;
    iVar7 = 0;
  }
  else {
    uVar14 = uVar15 - offset;
    if (amt + offset <= (uint)uVar2) {
      uVar14 = amt;
    }
    puVar12 = puVar5 + offset;
    puVar13 = local_60;
    if ((local_54 == 0) ||
       (iVar7 = sqlite3PagerWrite(pMVar4->pDbPage), puVar12 = local_60, puVar13 = puVar5 + offset,
       iVar7 == 0)) {
      puVar16 = local_60;
      memcpy(puVar13,puVar12,(long)(int)uVar14);
      iVar7 = 0;
      local_60 = puVar16;
    }
    local_60 = local_60 + (int)uVar14;
    amt = amt - uVar14;
    uVar15 = 0;
  }
  if ((iVar7 == 0) && (amt != 0)) {
    uVar1 = local_48->usableSize - 4;
    uVar2 = (pCur->info).nLocal;
    uVar11 = *(uint *)(puVar5 + uVar2);
    uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    local_64 = uVar11;
    if ((pCur->curFlags & 4) == 0) {
      pPVar8 = (Pgno *)0x0;
      uVar6 = (((local_48->usableSize - (uint)uVar2) + (pCur->info).nPayload) - 5) / uVar1;
      if (pCur->aOverflow == (Pgno *)0x0) {
LAB_001662d4:
        pPVar8 = (Pgno *)sqlite3Realloc(pPVar8,(long)(int)(uVar6 * 2) << 2);
        if (pPVar8 == (Pgno *)0x0) {
          return 7;
        }
        pCur->aOverflow = pPVar8;
      }
      else {
        iVar7 = (*sqlite3Config.m.xSize)(pCur->aOverflow);
        pPVar8 = pCur->aOverflow;
        if (iVar7 < (int)(uVar6 * 4)) goto LAB_001662d4;
      }
      lVar17 = 0;
      memset(pPVar8,0,(long)(int)uVar6 << 2);
      pCur->curFlags = pCur->curFlags | 4;
    }
    else {
      lVar17 = 0;
      if (pCur->aOverflow[(ulong)uVar15 / (ulong)uVar1] != 0) {
        lVar17 = (long)(int)((ulong)uVar15 / (ulong)uVar1);
        uVar11 = pCur->aOverflow[lVar17];
        uVar15 = uVar15 % uVar1;
        local_64 = uVar11;
      }
    }
    if (uVar11 != 0) {
      local_3c = (uint)(local_54 == 0) * 2;
      lVar17 = lVar17 * 4;
      do {
        pPVar8 = pCur->aOverflow;
        *(uint *)((long)pPVar8 + lVar17) = uVar11;
        if (uVar15 < uVar1) {
          uVar14 = uVar1 - uVar15;
          if (amt + uVar15 <= uVar1) {
            uVar14 = amt;
          }
          iVar7 = (*local_48->pPager->xGet)(local_48->pPager,uVar11,&local_38,local_3c);
          sVar10 = (size_t)(int)uVar14;
          if (iVar7 == 0) {
            puVar16 = (uchar *)((ulong)(uVar15 + 4) + (long)local_38->pData);
            uVar15 = *local_38->pData;
            local_64 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                       uVar15 << 0x18;
            puVar12 = puVar16;
            puVar13 = local_60;
            local_50 = sVar10;
            if ((local_54 == 0) ||
               (iVar7 = sqlite3PagerWrite(local_38), puVar12 = local_60, puVar13 = puVar16,
               iVar7 == 0)) {
              memcpy(puVar13,puVar12,local_50);
              iVar7 = 0;
            }
            uVar15 = 0;
            sVar10 = local_50;
            if (local_38 != (DbPage *)0x0) {
              sqlite3PagerUnrefNotNull(local_38);
              sVar10 = local_50;
            }
          }
          amt = amt - uVar14;
          if (amt == 0) {
            return iVar7;
          }
          local_60 = local_60 + sVar10;
        }
        else {
          uVar6 = *(uint *)((long)pPVar8 + lVar17 + 4);
          if (uVar6 == 0) {
            iVar7 = getOverflowPage(local_48,uVar11,(MemPage **)0x0,&local_64);
            uVar15 = uVar15 - uVar1;
          }
          else {
            iVar7 = 0;
            uVar15 = uVar15 - uVar1;
            local_64 = uVar6;
          }
        }
        if (iVar7 != 0) goto LAB_00166450;
        uVar11 = local_64;
        lVar17 = lVar17 + 4;
      } while (local_64 != 0);
    }
    iVar7 = 0;
  }
LAB_00166450:
  if (iVar7 != 0) {
    return iVar7;
  }
  if (amt == 0) {
    return 0;
  }
  uVar9 = 0x10a41;
LAB_0016647c:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
              "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->ix<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}